

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2RunnerNonRecursive.hpp
# Opt level: O1

void Centaurus::NonRecursiveReductionRunner::push_start_marker
               (CSTMarker *marker,
               vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> *starts,
               vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
               *tags)

{
  iterator __position;
  iterator __position_00;
  StackEntryTag local_14;
  
  __position._M_current =
       (tags->
       super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (tags->
      super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
    ::_M_realloc_insert<Centaurus::detail::StackEntryTag>(tags,__position,&local_14);
  }
  else {
    *__position._M_current = START_MARKER;
    (tags->
    super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
    )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  __position_00._M_current =
       (starts->super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (starts->super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>::
    _M_realloc_insert<Centaurus::CSTMarker_const&>
              ((vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>> *)starts,
               __position_00,marker);
  }
  else {
    (__position_00._M_current)->m_value = marker->m_value;
    (starts->super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>).
    _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  return;
}

Assistant:

static void push_start_marker(const CSTMarker& marker, std::vector<CSTMarker>& starts, std::vector<detail::StackEntryTag>& tags)
  {
    tags.emplace_back(detail::StackEntryTag::START_MARKER);
    starts.emplace_back(marker);
  }